

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall wasm::TypeBuilder::Impl::Entry::set(Entry *this,HeapTypeInfo *hti)

{
  HeapTypeKind HVar1;
  _Head_base<0UL,_wasm::(anonymous_namespace)::HeapTypeInfo_*,_false> _Var2;
  uintptr_t uVar3;
  
  HVar1 = hti->kind;
  _Var2._M_head_impl =
       (this->info)._M_t.
       super___uniq_ptr_impl<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
       .super__Head_base<0UL,_wasm::(anonymous_namespace)::HeapTypeInfo_*,_false>._M_head_impl;
  (_Var2._M_head_impl)->kind = HVar1;
  switch(HVar1) {
  case Basic:
    handle_unreachable("unexpected kind",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x8dd);
  case Func:
  case Array:
    uVar3 = (hti->field_9).signature.results.id;
    ((_Var2._M_head_impl)->field_9).signature.params = (Type)(hti->field_9).signature.params.id;
    *(uintptr_t *)((long)&(_Var2._M_head_impl)->field_9 + 8) = uVar3;
    break;
  case Struct:
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::_M_move_assign
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&(_Var2._M_head_impl)->field_9,
               &hti->field_9);
    break;
  case Cont:
    ((_Var2._M_head_impl)->field_9).signature.params = (Type)(hti->field_9).signature.params.id;
  }
  this->initialized = true;
  return;
}

Assistant:

void set(HeapTypeInfo&& hti) {
      info->kind = hti.kind;
      switch (info->kind) {
        case HeapTypeKind::Func:
          info->signature = hti.signature;
          break;
        case HeapTypeKind::Cont:
          info->continuation = hti.continuation;
          break;
        case HeapTypeKind::Struct:
          info->struct_ = std::move(hti.struct_);
          break;
        case HeapTypeKind::Array:
          info->array = hti.array;
          break;
        case HeapTypeKind::Basic:
          WASM_UNREACHABLE("unexpected kind");
      }
      initialized = true;
    }